

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall
QSocks5SocketEnginePrivate::~QSocks5SocketEnginePrivate(QSocks5SocketEnginePrivate *this)

{
  QAbstractSocketEnginePrivate *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QSocks5SocketEnginePrivate_0049fb38;
  QByteArray::~QByteArray((QByteArray *)0x36f691);
  QString::~QString((QString *)0x36f6a2);
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x36f6b3);
  QAbstractSocketEnginePrivate::~QAbstractSocketEnginePrivate(in_RDI);
  return;
}

Assistant:

QSocks5SocketEnginePrivate::~QSocks5SocketEnginePrivate()
{
}